

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O1

Aig_Obj_t * Aig_ManDupSimpleDfs_rec(Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Aig_Obj_t *pAVar1;
  ulong uVar2;
  Aig_Obj_t *p1;
  
  pAVar1 = (Aig_Obj_t *)(pObj->field_5).pData;
  if (pAVar1 == (Aig_Obj_t *)0x0) {
    Aig_ManDupSimpleDfs_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    if ((*(uint *)&pObj->field_0x18 & 7) == 4) {
      if (((ulong)pObj & 1) != 0) {
LAB_005f872d:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar2 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      if (uVar2 == 0) {
        pAVar1 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar2 + 0x28));
      }
    }
    else {
      Aig_ManDupSimpleDfs_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      if (((ulong)pObj & 1) != 0) goto LAB_005f872d;
      uVar2 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      if (uVar2 == 0) {
        pAVar1 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar2 + 0x28));
      }
      uVar2 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
      if (uVar2 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar2 + 0x28));
      }
      pAVar1 = Aig_And(pNew,pAVar1,p1);
    }
    (pObj->field_5).pData = pAVar1;
  }
  return pAVar1;
}

Assistant:

Aig_Obj_t * Aig_ManDupSimpleDfs_rec( Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    Aig_ManDupSimpleDfs_rec( pNew, p, Aig_ObjFanin0(pObj) );
    if ( Aig_ObjIsBuf(pObj) )
        return (Aig_Obj_t *)(pObj->pData = Aig_ObjChild0Copy(pObj));
    Aig_ManDupSimpleDfs_rec( pNew, p, Aig_ObjFanin1(pObj) );
    pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    return (Aig_Obj_t *)pObj->pData;
}